

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

word * Gia_SimRsbFunc(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins,int fOnSet)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word *pwVar5;
  word *pwVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  word *pFanins [16];
  
  iVar2 = 1 << ((char)vFanins->nSize - 6U & 0x1f);
  if (vFanins->nSize < 7) {
    iVar2 = 1;
  }
  pwVar4 = (word *)calloc((long)iVar2,8);
  pwVar5 = Vec_WrdEntryP(p->vSimsObj,iObj * p->nWords);
  pFanins[0xe] = (word *)0x0;
  pFanins[0xf] = (word *)0x0;
  pFanins[0xc] = (word *)0x0;
  pFanins[0xd] = (word *)0x0;
  pFanins[10] = (word *)0x0;
  pFanins[0xb] = (word *)0x0;
  pFanins[8] = (word *)0x0;
  pFanins[9] = (word *)0x0;
  pFanins[6] = (word *)0x0;
  pFanins[7] = (word *)0x0;
  pFanins[4] = (word *)0x0;
  pFanins[5] = (word *)0x0;
  pFanins[2] = (word *)0x0;
  pFanins[3] = (word *)0x0;
  pFanins[0] = (word *)0x0;
  pFanins[1] = (word *)0x0;
  uVar8 = vFanins->nSize;
  if ((int)uVar8 < 0x11) {
    for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
      iVar2 = Vec_IntEntry(vFanins,(int)lVar10);
      pwVar6 = Vec_WrdEntryP(p->vSimsObj,iVar2 * p->nWords);
      pFanins[lVar10] = pwVar6;
      uVar8 = vFanins->nSize;
    }
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    uVar8 = p->nWords << 6;
    if (p->nWords << 6 < 1) {
      uVar8 = 0;
    }
    uVar7 = 0;
    while (uVar12 = (uint)uVar7, uVar12 != uVar8) {
      uVar1 = uVar7 >> 6;
      if (((p->pFunc[2][uVar1] >> (uVar7 & 0x3f) & 1) != 0) &&
         ((uint)((pwVar5[uVar1] >> (uVar12 & 0x3f) & 1) != 0) == fOnSet)) {
        uVar3 = 0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          uVar11 = (ulong)(uint)(1 << ((byte)uVar7 & 0x1f));
          if ((pFanins[uVar7][uVar1] & 1L << (sbyte)(uVar12 & 0x3f)) == 0) {
            uVar11 = 0;
          }
          uVar3 = uVar3 | (uint)uVar11;
        }
        pwVar4[(int)uVar3 >> 6] = pwVar4[(int)uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
      }
      uVar7 = (ulong)(uVar12 + 1);
    }
    return pwVar4;
  }
  __assert_fail("Vec_IntSize(vFanins) <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x1cf,"word *Gia_SimRsbFunc(Gia_SimRsbMan_t *, int, Vec_Int_t *, int)");
}

Assistant:

word * Gia_SimRsbFunc( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins, int fOnSet )
{
    int nTruthWords = Abc_Truth6WordNum( Vec_IntSize(vFanins) );
    word * pTruth   = ABC_CALLOC( word, nTruthWords ); 
    word * pFunc    = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    word * pFanins[16] = {NULL};  int s, b, iMint, i, iFanin;
    assert( Vec_IntSize(vFanins) <= 16 );
    Vec_IntForEachEntry( vFanins, iFanin, i )
        pFanins[i] = Vec_WrdEntryP( p->vSimsObj, p->nWords*iFanin );
    for ( s = 0; s < 64*p->nWords; s++ )
    {
        if ( !Abc_TtGetBit(p->pFunc[2], s) || Abc_TtGetBit(pFunc, s) != fOnSet )
            continue;
        iMint = 0;
        for ( b = 0; b < Vec_IntSize(vFanins); b++ )
            if ( Abc_TtGetBit(pFanins[b], s) )
                iMint |= 1 << b;
        Abc_TtSetBit( pTruth, iMint );
    }
    return pTruth;
}